

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O1

void kv_set_var_nentry_update_test(btree_kv_ops *kv_ops)

{
  code *pcVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  undefined8 *puVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  long *plVar10;
  char **ppcVar11;
  char *apcStack_c0 [13];
  undefined1 local_58 [8];
  timeval __test_begin;
  char local_31 [8];
  uint8_t v;
  
  __test_begin.tv_usec = (__suseconds_t)kv_ops;
  gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
  memleak_start();
  puVar5 = (undefined8 *)malloc(0x1010);
  *puVar5 = 0;
  puVar5[1] = 0;
  *(undefined2 *)puVar5 = 0x801;
  *(undefined4 *)((long)puVar5 + 4) = 0xa0001;
  puVar5[1] = puVar5 + 2;
  plVar10 = puVar5 + 1;
  local_31[0] = 'd';
  uVar9 = 0;
  lVar8 = 0;
  ppcVar11 = apcStack_c0 + 3;
  do {
    pcVar7 = (char *)ppcVar11;
    ppcVar11 = (char **)(pcVar7 + -0x10);
    apcStack_c0[uVar9 + 3] = (char *)ppcVar11;
    pcVar7[-0x18] = -0x70;
    pcVar7[-0x17] = '/';
    pcVar7[-0x16] = '\x10';
    pcVar7[-0x15] = '\0';
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    sprintf((char *)ppcVar11,"key%d",uVar9 & 0xffffffff);
    pcVar1 = *(code **)(__test_begin.tv_usec + 8);
    pcVar7[-0x18] = -0x57;
    pcVar7[-0x17] = '/';
    pcVar7[-0x16] = '\x10';
    pcVar7[-0x15] = '\0';
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    (*pcVar1)(puVar5,uVar9 & 0xffff,ppcVar11,local_31);
    lVar2 = puVar5[1];
    pcVar7[-0x18] = -0x48;
    pcVar7[-0x17] = '/';
    pcVar7[-0x16] = '\x10';
    pcVar7[-0x15] = '\0';
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    sVar6 = strlen((char *)ppcVar11);
    pcVar7[-0x18] = -0x3a;
    pcVar7[-0x17] = '/';
    pcVar7[-0x16] = '\x10';
    pcVar7[-0x15] = '\0';
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    iVar4 = bcmp((void *)(lVar2 + lVar8),ppcVar11,sVar6);
    if (iVar4 != 0) {
      pcVar7[-0x18] = -0xc;
      pcVar7[-0x17] = '/';
      pcVar7[-0x16] = '\x10';
      pcVar7[-0x15] = '\0';
      pcVar7[-0x14] = '\0';
      pcVar7[-0x13] = '\0';
      pcVar7[-0x12] = '\0';
      pcVar7[-0x11] = '\0';
      kv_set_var_nentry_update_test();
    }
    if (*(char *)(*plVar10 + 8 + lVar8) != local_31[0]) {
      builtin_strncpy(pcVar7 + -0x18,"\a0\x10",4);
      pcVar7[-0x14] = '\0';
      pcVar7[-0x13] = '\0';
      pcVar7[-0x12] = '\0';
      pcVar7[-0x11] = '\0';
      kv_set_var_nentry_update_test();
    }
    lVar8 = lVar8 + 9;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 10);
  uVar9 = 0;
  lVar8 = 0;
  do {
    pcVar3 = apcStack_c0[uVar9 + 3];
    pcVar1 = *(code **)(__test_begin.tv_usec + 8);
    builtin_strncpy(pcVar7 + -0x18,"00\x10",4);
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    (*pcVar1)(puVar5,uVar9 & 0xffff,pcVar3,local_31);
    lVar2 = puVar5[1];
    builtin_strncpy(pcVar7 + -0x18,"?0\x10",4);
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    sVar6 = strlen(pcVar3);
    builtin_strncpy(pcVar7 + -0x18,"M0\x10",4);
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    iVar4 = bcmp((void *)(lVar2 + lVar8),pcVar3,sVar6);
    if (iVar4 != 0) {
      builtin_strncpy(pcVar7 + -0x18,"{0\x10",4);
      pcVar7[-0x14] = '\0';
      pcVar7[-0x13] = '\0';
      pcVar7[-0x12] = '\0';
      pcVar7[-0x11] = '\0';
      kv_set_var_nentry_update_test();
    }
    if (*(char *)(*plVar10 + 8 + lVar8) != local_31[0]) {
      pcVar7[-0x18] = -0x73;
      pcVar7[-0x17] = '0';
      pcVar7[-0x16] = '\x10';
      pcVar7[-0x15] = '\0';
      pcVar7[-0x14] = '\0';
      pcVar7[-0x13] = '\0';
      pcVar7[-0x12] = '\0';
      pcVar7[-0x11] = '\0';
      kv_set_var_nentry_update_test();
    }
    lVar8 = lVar8 + 9;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 10);
  ppcVar11 = apcStack_c0 + 3;
  pcVar1 = *(code **)(__test_begin.tv_usec + 8);
  pcVar7[-0x18] = -0x4f;
  pcVar7[-0x17] = '0';
  pcVar7[-0x16] = '\x10';
  pcVar7[-0x15] = '\0';
  pcVar7[-0x14] = '\0';
  pcVar7[-0x13] = '\0';
  pcVar7[-0x12] = '\0';
  pcVar7[-0x11] = '\0';
  (*pcVar1)(puVar5,9,apcStack_c0[3],local_31);
  pcVar7[-0x18] = -0x3f;
  pcVar7[-0x17] = '0';
  pcVar7[-0x16] = '\x10';
  pcVar7[-0x15] = '\0';
  pcVar7[-0x14] = '\0';
  pcVar7[-0x13] = '\0';
  pcVar7[-0x12] = '\0';
  pcVar7[-0x11] = '\0';
  strcpy(apcStack_c0[3],apcStack_c0[0xc]);
  lVar8 = 0;
  pcVar1 = *(code **)(__test_begin.tv_usec + 8);
  pcVar7[-0x18] = -0x28;
  pcVar7[-0x17] = '0';
  pcVar7[-0x16] = '\x10';
  pcVar7[-0x15] = '\0';
  pcVar7[-0x14] = '\0';
  pcVar7[-0x13] = '\0';
  pcVar7[-0x12] = '\0';
  pcVar7[-0x11] = '\0';
  (*pcVar1)(puVar5,0,apcStack_c0[0xc],local_31);
  builtin_strncpy(apcStack_c0[0xc],"key0",5);
  do {
    lVar2 = *plVar10;
    pcVar3 = *ppcVar11;
    pcVar7[-0x18] = -10;
    pcVar7[-0x17] = '0';
    pcVar7[-0x16] = '\x10';
    pcVar7[-0x15] = '\0';
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    sVar6 = strlen(pcVar3);
    builtin_strncpy(pcVar7 + -0x18,"\x041\x10",4);
    pcVar7[-0x14] = '\0';
    pcVar7[-0x13] = '\0';
    pcVar7[-0x12] = '\0';
    pcVar7[-0x11] = '\0';
    iVar4 = bcmp((void *)(lVar2 + lVar8),pcVar3,sVar6);
    if (iVar4 != 0) {
      builtin_strncpy(pcVar7 + -0x18,"31\x10",4);
      pcVar7[-0x14] = '\0';
      pcVar7[-0x13] = '\0';
      pcVar7[-0x12] = '\0';
      pcVar7[-0x11] = '\0';
      kv_set_var_nentry_update_test();
    }
    if (*(char *)(*plVar10 + 8 + lVar8) != local_31[0]) {
      builtin_strncpy(pcVar7 + -0x18,"E1\x10",4);
      pcVar7[-0x14] = '\0';
      pcVar7[-0x13] = '\0';
      pcVar7[-0x12] = '\0';
      pcVar7[-0x11] = '\0';
      kv_set_var_nentry_update_test();
    }
    lVar8 = lVar8 + 9;
    ppcVar11 = ppcVar11 + 1;
  } while (lVar8 != 0x5a);
  builtin_strncpy(pcVar7 + -0x18,"X1\x10",4);
  pcVar7[-0x14] = '\0';
  pcVar7[-0x13] = '\0';
  pcVar7[-0x12] = '\0';
  pcVar7[-0x11] = '\0';
  kv_set_var_nentry_update_test();
  return;
}

Assistant:

void kv_set_var_nentry_update_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t v;
    int i, n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    size_t offset = 0;
    char **key = alca(char*, n);

    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;

    // first pass
    for (i = 0; i < n; i++) {
        key[i] = alca(char, ksize);
        sprintf(key[i], "key%d", i);
        kv_ops->set_kv(node, i, key[i], (void *)&v);

        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i])));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;

    }

    offset = 0;

    // second pass
    for (i = 0; i < n; i++) {

        kv_ops->set_kv(node, i, key[i], (void *)&v);
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i])));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;
    }

    /* swap first/last entries */

    // copy first key to last
    kv_ops->set_kv(node, n-1, key[0], (void *)&v);
    strcpy(key[0], key[n-1]);

    // copy last key to first
    kv_ops->set_kv(node, 0, key[n-1], (void *)&v);
    strcpy(key[n-1], "key0");

    // verify
    offset = 0;
    for (i = 0; i < n; i++) {
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i])));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;
    }

    free(node);
    memleak_end();
    TEST_RESULT("kv_set_var_nentry_update_test");
}